

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O3

reference __thiscall
gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
          (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this,
          size_type_conflict n)

{
  S2ClippedShape *pSVar1;
  S2LogMessage SStack_18;
  
  if (n < (*(uint *)this & 0xffffff)) {
    if (this->is_inlined_ == false) {
      pSVar1 = (this->field_7).pointer_;
    }
    else {
      pSVar1 = (S2ClippedShape *)&this->field_7;
    }
    return pSVar1 + n;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/compact_array.h"
             ,0x134,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (n) < (size_) ",0x1c);
  abort();
}

Assistant:

reference operator[](size_type n) {
    S2_DCHECK_LT(n, size_);
    return Array()[n];
  }